

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_noncentral_absolute_pose.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  size_type sVar2;
  void *pvVar3;
  size_type sVar4;
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *m;
  double dVar5;
  ostream *s;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar6;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  timeval tVar15;
  timeval tVar16;
  size_t i_5;
  size_t i_4;
  transformation_t nonlinear_transformation_10;
  vector<int,_std::allocator<int>_> indices10;
  double nonlinear_time;
  size_t i_3;
  transformation_t nonlinear_transformation;
  rotation_t R_perturbed;
  translation_t t_perturbed;
  double upnp_time;
  size_t i_2;
  transformations_t upnp_transformations;
  transformation_t gpnp_transformation_6;
  vector<int,_std::allocator<int>_> indices6;
  double gpnp_time;
  size_t i_1;
  transformation_t gpnp_transformation;
  double gp3p_time;
  size_t i;
  transformations_t gp3p_transformations;
  size_t iterations;
  timeval toc;
  timeval tic;
  NoncentralAbsoluteAdapter adapter;
  MatrixXd gt;
  vector<int,_std::allocator<int>_> camCorrespondences;
  points_t points;
  bearingVectors_t bearingVectors;
  rotations_t camRotations;
  translations_t camOffsets;
  rotation_t rotation;
  translation_t position;
  int numberCameras;
  size_t numberPoints;
  double outlierFraction;
  double noise;
  undefined1 *outlierFraction_00;
  Matrix<double,_3,_4,_0,_3,_4> *other;
  AbsoluteAdapterBase *this;
  rotation_t *rotation_00;
  translation_t *in_stack_fffffffffffff818;
  AbsoluteAdapterBase *in_stack_fffffffffffff820;
  NoncentralAbsoluteAdapter *in_stack_fffffffffffff828;
  AbsoluteAdapterBase *in_stack_fffffffffffff830;
  rotation_t *in_stack_fffffffffffff838;
  size_t in_stack_fffffffffffff848;
  size_t in_stack_fffffffffffff850;
  size_t in_stack_fffffffffffff858;
  AbsoluteAdapterBase *in_stack_fffffffffffff860;
  rotations_t *in_stack_fffffffffffff868;
  translations_t *in_stack_fffffffffffff870;
  undefined8 in_stack_fffffffffffff878;
  int iVar17;
  double in_stack_fffffffffffff888;
  rotation_t *in_stack_fffffffffffff890;
  translation_t *in_stack_fffffffffffff898;
  rotation_t *in_stack_fffffffffffff8a0;
  translation_t *in_stack_fffffffffffff8a8;
  size_type local_650;
  ulong local_648;
  ulong local_528;
  ulong local_420;
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  local_418 [5];
  bearingVectors_t *in_stack_fffffffffffffc60;
  double in_stack_fffffffffffffc68;
  double in_stack_fffffffffffffc70;
  size_t in_stack_fffffffffffffc78;
  rotations_t *in_stack_fffffffffffffc80;
  translations_t *in_stack_fffffffffffffc88;
  rotation_t *in_stack_fffffffffffffc90;
  translation_t *in_stack_fffffffffffffc98;
  points_t *in_stack_fffffffffffffca8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffcb0;
  MatrixXd *in_stack_fffffffffffffcb8;
  ulong local_2e8;
  double in_stack_fffffffffffffdc0;
  ulong uVar18;
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  local_238;
  ulong local_220;
  timeval local_218;
  timeval local_208 [10];
  undefined4 local_164;
  undefined1 local_160 [48];
  undefined1 local_130 [112];
  Matrix<double,_3,_4,_0,_3,_4> local_c0;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  int local_34;
  
  iVar17 = (int)((ulong)in_stack_fffffffffffff878 >> 0x20);
  local_34 = 0;
  opengv::initializeRandomSeed();
  local_48 = 0;
  local_50 = 0;
  local_58 = 100;
  local_5c = 4;
  opengv::generateRandomTranslation((double)in_stack_fffffffffffff860);
  opengv::generateRandomRotation(in_stack_fffffffffffffdc0);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x6c9424);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            *)0x6c9431);
  opengv::generateRandomCameraSystem(iVar17,in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x6c945e);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)0x6c946d);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6c947c);
  local_164 = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff828,
             (int *)in_stack_fffffffffffff820,(unsigned_long *)in_stack_fffffffffffff818);
  rotation_00 = (rotation_t *)local_160;
  this = (AbsoluteAdapterBase *)(local_160 + 0x18);
  outlierFraction_00 = local_130;
  opengv::generateRandom2D3DCorrespondences
            (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
             in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffca8,
             in_stack_fffffffffffffcb0,in_stack_fffffffffffffcb8);
  opengv::printExperimentCharacteristics
            (in_stack_fffffffffffff818,rotation_00,(double)this,(double)outlierFraction_00);
  other = &local_c0;
  opengv::absolute_pose::NoncentralAbsoluteAdapter::NoncentralAbsoluteAdapter
            (in_stack_fffffffffffff828,(bearingVectors_t *)in_stack_fffffffffffff820,
             (camCorrespondences_t *)in_stack_fffffffffffff818,(points_t *)rotation_00,
             (translations_t *)this,(rotations_t *)other,in_stack_fffffffffffff838);
  local_220 = 0x32;
  std::operator<<((ostream *)&std::cout,"running Kneip\'s GP3P (using first three correspondences/")
  ;
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  uVar6 = extraout_XMM0_Qb;
  std::
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            *)0x6c95c6);
  gettimeofday(local_208,(__timezone_ptr_t)0x0);
  for (uVar18 = 0; uVar18 < local_220; uVar18 = uVar18 + 1) {
    opengv::absolute_pose::gp3p
              (in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850,
               in_stack_fffffffffffff848);
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::operator=((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                 *)in_stack_fffffffffffff818,
                (vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                 *)rotation_00);
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::~vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
               *)in_stack_fffffffffffff818);
  }
  gettimeofday(&local_218,(__timezone_ptr_t)0x0);
  tVar15 = timeval_minus((timeval *)&local_218,(timeval *)local_208);
  tVar16 = timeval_minus((timeval *)&local_218,(timeval *)local_208);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (double)tVar15.tv_sec;
  auVar7._0_8_ = (double)tVar16.tv_usec;
  auVar7._8_8_ = uVar6;
  auVar11 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar7,auVar11);
  auVar7 = vcvtusi2sd_avx512f(auVar7,local_220);
  poVar1 = std::operator<<((ostream *)&std::cout,"running gpnp over all correspondences");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar6 = extraout_XMM0_Qb_00;
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x6c983a);
  gettimeofday(local_208,(__timezone_ptr_t)0x0);
  for (local_2e8 = 0; local_2e8 < local_220; local_2e8 = local_2e8 + 1) {
    opengv::absolute_pose::gpnp(in_stack_fffffffffffff820);
    Eigen::Matrix<double,_3,_4,_0,_3,_4>::operator=((Matrix<double,_3,_4,_0,_3,_4> *)this,other);
  }
  gettimeofday(&local_218,(__timezone_ptr_t)0x0);
  tVar15 = timeval_minus((timeval *)&local_218,(timeval *)local_208);
  tVar16 = timeval_minus((timeval *)&local_218,(timeval *)local_208);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (double)tVar15.tv_sec;
  auVar8._0_8_ = (double)tVar16.tv_usec;
  auVar8._8_8_ = uVar6;
  auVar12 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar8,auVar12);
  auVar8 = vcvtusi2sd_avx512f(auVar8,local_220);
  dVar5 = auVar12._0_8_ / auVar8._0_8_;
  poVar1 = std::operator<<((ostream *)&std::cout,"running gpnp over 6 correspondences");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  opengv::getNindices((int)((ulong)in_stack_fffffffffffff820 >> 0x20));
  opengv::absolute_pose::gpnp
            (in_stack_fffffffffffff830,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff828);
  poVar1 = std::operator<<((ostream *)&std::cout,"running upnp over all correspondences");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar6 = extraout_XMM0_Qb_01;
  std::
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            *)0x6c9a45);
  gettimeofday(local_208,(__timezone_ptr_t)0x0);
  for (local_420 = 0; local_420 < local_220; local_420 = local_420 + 1) {
    opengv::absolute_pose::upnp(in_stack_fffffffffffff820);
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::operator=((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                 *)in_stack_fffffffffffff818,
                (vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                 *)rotation_00);
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::~vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
               *)in_stack_fffffffffffff818);
  }
  gettimeofday(&local_218,(__timezone_ptr_t)0x0);
  tVar15 = timeval_minus((timeval *)&local_218,(timeval *)local_208);
  tVar16 = timeval_minus((timeval *)&local_218,(timeval *)local_208);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (double)tVar15.tv_sec;
  auVar9._0_8_ = (double)tVar16.tv_usec;
  auVar9._8_8_ = uVar6;
  auVar12 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar9,auVar13);
  auVar8 = vcvtusi2sd_avx512f(auVar9,local_220);
  std::operator<<((ostream *)&std::cout,"setting perturbed pose and ");
  poVar1 = std::operator<<((ostream *)&std::cout,"performing nonlinear optimization");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x6c9c42);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x6c9c51);
  uVar6 = 0;
  opengv::getPerturbedPose
            (in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,
             in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x6c9c8f);
  gettimeofday(local_208,(__timezone_ptr_t)0x0);
  for (local_528 = 0; local_528 < local_220; local_528 = local_528 + 1) {
    opengv::absolute_pose::AbsoluteAdapterBase::sett(this,(translation_t *)other);
    opengv::absolute_pose::AbsoluteAdapterBase::setR(this,(rotation_t *)other);
    opengv::absolute_pose::optimize_nonlinear(in_stack_fffffffffffff820);
    Eigen::Matrix<double,_3,_4,_0,_3,_4>::operator=((Matrix<double,_3,_4,_0,_3,_4> *)this,other);
  }
  gettimeofday(&local_218,(__timezone_ptr_t)0x0);
  iVar17 = (int)((ulong)in_stack_fffffffffffff820 >> 0x20);
  tVar15 = timeval_minus((timeval *)&local_218,(timeval *)local_208);
  m = (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)tVar15.tv_usec;
  tVar16 = timeval_minus((timeval *)&local_218,(timeval *)local_208);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (double)tVar15.tv_sec;
  auVar10._0_8_ = (double)tVar16.tv_usec;
  auVar10._8_8_ = uVar6;
  auVar13 = vfmadd213sd_fma(ZEXT816(0x3eb0c6f7a0b5ed8d),auVar10,auVar14);
  auVar9 = vcvtusi2sd_avx512f(auVar10,local_220);
  s = (ostream *)(auVar13._0_8_ / auVar9._0_8_);
  std::operator<<((ostream *)&std::cout,"setting perturbed pose and ");
  std::operator<<((ostream *)&std::cout,"performing nonlinear optimization with 10 correspondences")
  ;
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  opengv::getNindices(iVar17);
  opengv::getPerturbedPose
            (in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,
             in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  opengv::absolute_pose::AbsoluteAdapterBase::sett(this,(translation_t *)other);
  opengv::absolute_pose::AbsoluteAdapterBase::setR(this,(rotation_t *)other);
  opengv::absolute_pose::optimize_nonlinear
            (in_stack_fffffffffffff830,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff828);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from gp3p algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_648 = 0;
  while( true ) {
    sVar2 = std::
            vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            ::size(&local_238);
    if (sVar2 <= local_648) break;
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::operator[](&local_238,local_648);
    poVar1 = Eigen::operator<<(s,m);
    pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    local_648 = local_648 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from gpnp algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(s,m);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"results from gpnp algorithm with only 6 correspondences:");
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(s,m);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from upnp algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_650 = 0;
  while( true ) {
    sVar2 = local_650;
    sVar4 = std::
            vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            ::size(local_418);
    if (sVar4 <= sVar2) break;
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::operator[](local_418,local_650);
    poVar1 = Eigen::operator<<(s,m);
    pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    local_650 = local_650 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from nonlinear algorithm:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(s,m);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,
                  "results from nonlinear algorithm with only 10 correspondences:");
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(s,m);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from gp3p algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,auVar11._0_8_ / auVar7._0_8_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from gpnp algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,dVar5);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from upnp algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,auVar12._0_8_ / auVar8._0_8_);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"timings from nonlinear algorithm: ");
  pvVar3 = (void *)std::ostream::operator<<(&std::cout,(double)s);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff818);
  std::
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
             *)in_stack_fffffffffffff818);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff818);
  std::
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
             *)in_stack_fffffffffffff818);
  opengv::absolute_pose::NoncentralAbsoluteAdapter::~NoncentralAbsoluteAdapter
            ((NoncentralAbsoluteAdapter *)0x6ca413);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x6ca420);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff818);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)in_stack_fffffffffffff818);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)in_stack_fffffffffffff818);
  std::
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             *)in_stack_fffffffffffff818);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)in_stack_fffffffffffff818);
  return local_34;
}

Assistant:

int main( int argc, char** argv )
{
  //initialize random seed
  initializeRandomSeed();
  
  //set experiment parameters
  double noise = 0.0;
  double outlierFraction = 0.0;
  size_t numberPoints = 100;
  int numberCameras = 4;

  //create a random viewpoint pose
  translation_t position = generateRandomTranslation(2.0);
  rotation_t rotation = generateRandomRotation(0.5);
  
  //create a random camera-system
  translations_t camOffsets;
  rotations_t camRotations;
  generateRandomCameraSystem( numberCameras, camOffsets, camRotations );
  
  //derive correspondences based on random point-cloud
  bearingVectors_t bearingVectors;
  points_t points;
  std::vector<int> camCorrespondences;
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom2D3DCorrespondences(
      position, rotation, camOffsets, camRotations, numberPoints, noise, outlierFraction,
      bearingVectors, points, camCorrespondences, gt );

  //print the experiment characteristics
  printExperimentCharacteristics(
      position, rotation, noise, outlierFraction );

  //create a non-central absolute adapter
  absolute_pose::NoncentralAbsoluteAdapter adapter(
      bearingVectors,
      camCorrespondences,
      points,
      camOffsets,
      camRotations,
      rotation);

  //timer
  struct timeval tic;
  struct timeval toc;
  size_t iterations = 50;

  //run the experiments
  std::cout << "running Kneip's GP3P (using first three correspondences/";
  std::cout << std::endl;
  transformations_t gp3p_transformations;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    gp3p_transformations = absolute_pose::gp3p(adapter);
  gettimeofday( &toc, 0 );
  double gp3p_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running gpnp over all correspondences" << std::endl;
  transformation_t gpnp_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    gpnp_transformation = absolute_pose::gpnp(adapter);
  gettimeofday( &toc, 0 );
  double gpnp_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running gpnp over 6 correspondences" << std::endl;
  std::vector<int> indices6 = getNindices(6);
  transformation_t gpnp_transformation_6 =
      absolute_pose::gpnp(adapter,indices6);
  
  std::cout << "running upnp over all correspondences" << std::endl;
  transformations_t upnp_transformations;
  gettimeofday( &tic, 0 );
  for( size_t i = 0; i < iterations; i++ )
    upnp_transformations = absolute_pose::upnp(adapter);
  gettimeofday( &toc, 0);
  double upnp_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;
  
  //std::cout << "running upnp over 6 correspondences" << std::endl;
  //transformations_t upnp_transformations_6 =
  //    absolute_pose::upnp(adapter,indices6);

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization" << std::endl;
  //add a small perturbation to the rotation
  translation_t t_perturbed; rotation_t R_perturbed;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1 );
  transformation_t nonlinear_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
  {
    adapter.sett(t_perturbed);
    adapter.setR(R_perturbed);
    nonlinear_transformation = absolute_pose::optimize_nonlinear(adapter);
  }
  gettimeofday( &toc, 0 );
  double nonlinear_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization with 10 correspondences";
  std::cout << std::endl;
  std::vector<int> indices10 = getNindices(10);
  //add a small perturbation to the rotation
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1 );
  adapter.sett(t_perturbed);
  adapter.setR(R_perturbed);
  transformation_t nonlinear_transformation_10 =
      absolute_pose::optimize_nonlinear(adapter,indices10);

  //print the results
  std::cout << "results from gp3p algorithm:" << std::endl;
  for(size_t i = 0; i < gp3p_transformations.size(); i++)
    std::cout << gp3p_transformations[i] << std::endl << std::endl;
  std::cout << "results from gpnp algorithm:" << std::endl;
  std::cout << gpnp_transformation << std::endl << std::endl;
  std::cout << "results from gpnp algorithm with only 6 correspondences:";
  std::cout << std::endl;
  std::cout << gpnp_transformation_6 << std::endl << std::endl;
  std::cout << "results from upnp algorithm:" << std::endl;
  for(size_t i = 0; i < upnp_transformations.size(); i++)
    std::cout << upnp_transformations[i] << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm:" << std::endl;
  std::cout << nonlinear_transformation << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm with only 10 correspondences:";
  std::cout << std::endl;
  std::cout << nonlinear_transformation_10 << std::endl << std::endl;

  std::cout << "timings from gp3p algorithm: ";
  std::cout << gp3p_time << std::endl;
  std::cout << "timings from gpnp algorithm: ";
  std::cout << gpnp_time << std::endl;
  std::cout << "timings from upnp algorithm: ";
  std::cout << upnp_time << std::endl;
  std::cout << "timings from nonlinear algorithm: ";
  std::cout << nonlinear_time << std::endl;
}